

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  internal *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  string local_98 [32];
  string local_78 [32];
  undefined4 local_58;
  undefined1 local_41 [9];
  string file_name;
  int line_local;
  char *file_local;
  
  file_name.field_2._12_4_ = SUB84(file,0);
  local_d0 = this;
  if (this == (internal *)0x0) {
    local_d0 = (internal *)0x9eca4b;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_41 + 1),(char *)local_d0,(allocator<char> *)__lhs);
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  if ((int)file_name.field_2._12_4_ < 0) {
    std::operator+(in_stack_ffffffffffffff48,(char *)__return_storage_ptr__);
  }
  else {
    std::operator+(in_stack_ffffffffffffff48,(char *)__return_storage_ptr__);
    StreamableToString<int>
              ((string *)&stack0xffffffffffffff48,(int *)(file_name.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(__lhs,(char *)local_d0);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_98);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)(local_41 + 1));
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}